

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O3

Aig_Man_t * Saig_ManWindowExtractMiter(Aig_Man_t *p0,Aig_Man_t *p1)

{
  int iVar1;
  Aig_Obj_t **ppAVar2;
  Aig_Obj_t *pAVar3;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar4;
  void **ppvVar5;
  int *piVar6;
  void *pvVar7;
  uint uVar8;
  long lVar9;
  Vec_Ptr_t *vNodes0;
  Vec_Ptr_t *vNodes0_00;
  ulong uVar10;
  Aig_Man_t *pNew;
  char *pcVar11;
  Aig_Obj_t *pAVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  Aig_Obj_t *pAVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  
  iVar19 = p0->nTruePos;
  lVar9 = (long)iVar19;
  if (0 < lVar9) {
    lVar15 = 0;
    do {
      if ((p0->vCos->nSize <= lVar15) || (p1->vCos->nSize <= lVar15)) goto LAB_006fe101;
      if (p0->pReprs == (Aig_Obj_t **)0x0) goto LAB_006fe120;
      pAVar12 = (Aig_Obj_t *)p0->vCos->pArray[lVar15];
      pAVar16 = (Aig_Obj_t *)p1->vCos->pArray[lVar15];
      p0->pReprs[pAVar12->Id] = pAVar16;
      if (p1->pReprs == (Aig_Obj_t **)0x0) goto LAB_006fe120;
      p1->pReprs[pAVar16->Id] = pAVar12;
      lVar15 = lVar15 + 1;
    } while (lVar9 != lVar15);
  }
  lVar15 = (long)p0->nRegs;
  if (0 < lVar15) {
    do {
      if ((iVar19 < 0) || (p0->vCos->nSize <= lVar9)) goto LAB_006fe101;
      pAVar12 = (Aig_Obj_t *)p0->vCos->pArray[lVar9];
      if (((*(uint *)&pAVar12->field_0x18 & 7) != 3) || ((pAVar12->field_0).CioId < iVar19)) {
        __assert_fail("Saig_ObjIsLi(p, pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                      ,0x57,"Aig_Obj_t *Saig_ObjLiToLo(Aig_Man_t *, Aig_Obj_t *)");
      }
      uVar17 = ((pAVar12->field_0).CioId - iVar19) + p0->nTruePis;
      if (((int)uVar17 < 0) || (p0->vCis->nSize <= (int)uVar17)) goto LAB_006fe101;
      ppAVar2 = p0->pReprs;
      if (ppAVar2 != (Aig_Obj_t **)0x0) {
        pAVar16 = (Aig_Obj_t *)p0->vCis->pArray[uVar17];
        pAVar3 = ppAVar2[pAVar16->Id];
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          if ((p1->pReprs == (Aig_Obj_t **)0x0) || (pAVar16 != p1->pReprs[pAVar3->Id])) {
            __assert_fail("pMatch0 == Aig_ObjRepr( p1, pMatch1 )",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                          ,0x2df,"Aig_Man_t *Saig_ManWindowExtractMiter(Aig_Man_t *, Aig_Man_t *)");
          }
          if (((*(uint *)&pAVar3->field_0x18 & 7) != 2) || ((pAVar3->field_0).CioId < p1->nTruePis))
          {
            __assert_fail("Saig_ObjIsLo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saig.h"
                          ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
          }
          uVar17 = ((pAVar3->field_0).CioId - p1->nTruePis) + p1->nTruePos;
          if (((int)uVar17 < 0) || (p1->vCos->nSize <= (int)uVar17)) goto LAB_006fe101;
          pAVar16 = (Aig_Obj_t *)p1->vCos->pArray[uVar17];
          ppAVar2[pAVar12->Id] = pAVar16;
          if (p1->pReprs == (Aig_Obj_t **)0x0) {
LAB_006fe120:
            __assert_fail("p->pReprs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
          }
          p1->pReprs[pAVar16->Id] = pAVar12;
        }
      }
      lVar9 = lVar9 + 1;
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
  }
  Aig_ManCleanData(p0);
  Aig_ManCleanData(p1);
  vNodes0 = Saig_ManCollectedDiffNodes(p0,p1);
  vNodes0_00 = Saig_ManCollectedDiffNodes(p1,p0);
  iVar19 = vNodes0->nSize;
  lVar9 = (long)iVar19;
  uVar17 = vNodes0_00->nSize;
  uVar10 = (ulong)uVar17;
  pNew = Aig_ManStart(uVar17 + iVar19);
  pcVar11 = (char *)malloc(4);
  builtin_strncpy(pcVar11,"wnd",4);
  pNew->pName = pcVar11;
  pNew->pSpec = (char *)0x0;
  aVar4 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)pNew->pConst1;
  p0->pConst1->field_5 = aVar4;
  p1->pConst1->field_5 = aVar4;
  Saig_ManWindowCreatePis(pNew,p0,p1,vNodes0);
  Saig_ManWindowCreatePis(pNew,p1,p0,vNodes0_00);
  if (0 < lVar9) {
    ppvVar5 = vNodes0->pArray;
    lVar15 = 0;
    do {
      piVar6 = (int *)ppvVar5[lVar15];
      if (((piVar6[6] & 7U) == 2) && (p0->nTruePis <= *piVar6)) {
        pAVar12 = Aig_ObjCreateCi(pNew);
        *(Aig_Obj_t **)(piVar6 + 10) = pAVar12;
      }
      lVar15 = lVar15 + 1;
    } while (lVar9 != lVar15);
  }
  if (0 < (int)uVar17) {
    ppvVar5 = vNodes0_00->pArray;
    uVar18 = 0;
    do {
      piVar6 = (int *)ppvVar5[uVar18];
      if (((piVar6[6] & 7U) == 2) && (p1->nTruePis <= *piVar6)) {
        pAVar12 = Aig_ObjCreateCi(pNew);
        *(Aig_Obj_t **)(piVar6 + 10) = pAVar12;
      }
      uVar18 = uVar18 + 1;
    } while (uVar10 != uVar18);
  }
  if (0 < iVar19) {
    ppvVar5 = vNodes0->pArray;
    lVar15 = 0;
    do {
      pvVar7 = ppvVar5[lVar15];
      if (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7) {
        if (((ulong)pvVar7 & 1) != 0) goto LAB_006fe15e;
        uVar18 = *(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe;
        if (uVar18 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar7 + 8) & 1) ^ *(ulong *)(uVar18 + 0x28));
        }
        uVar18 = *(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe;
        if (uVar18 == 0) {
          pAVar16 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar16 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar7 + 0x10) & 1) ^ *(ulong *)(uVar18 + 0x28))
          ;
        }
        pAVar12 = Aig_And(pNew,pAVar12,pAVar16);
        *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar12;
      }
      lVar15 = lVar15 + 1;
    } while (lVar9 != lVar15);
  }
  if (0 < (int)uVar17) {
    ppvVar5 = vNodes0_00->pArray;
    uVar18 = 0;
    do {
      pvVar7 = ppvVar5[uVar18];
      if (0xfffffffd < (*(uint *)((long)pvVar7 + 0x18) & 7) - 7) {
        if (((ulong)pvVar7 & 1) != 0) goto LAB_006fe15e;
        uVar13 = *(ulong *)((long)pvVar7 + 8) & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar7 + 8) & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        uVar13 = *(ulong *)((long)pvVar7 + 0x10) & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar16 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar16 = (Aig_Obj_t *)
                    ((ulong)((uint)*(ulong *)((long)pvVar7 + 0x10) & 1) ^ *(ulong *)(uVar13 + 0x28))
          ;
        }
        pAVar12 = Aig_And(pNew,pAVar12,pAVar16);
        *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar12;
      }
      uVar18 = uVar18 + 1;
    } while (uVar10 != uVar18);
  }
  Saig_ManWindowCreatePos(pNew,p0,p1);
  if (iVar19 < 1) {
    iVar19 = 0;
  }
  else {
    ppvVar5 = vNodes0->pArray;
    lVar15 = 0;
    iVar19 = 0;
    do {
      if (((*(uint *)((long)ppvVar5[lVar15] + 0x18) & 7) == 2) &&
         (iVar1 = *ppvVar5[lVar15], p0->nTruePis <= iVar1)) {
        uVar8 = (iVar1 - p0->nTruePis) + p0->nTruePos;
        if (((int)uVar8 < 0) || (p0->vCos->nSize <= (int)uVar8)) goto LAB_006fe101;
        pvVar7 = p0->vCos->pArray[uVar8];
        if (((ulong)pvVar7 & 1) != 0) goto LAB_006fe15e;
        uVar18 = *(ulong *)((long)pvVar7 + 8);
        uVar13 = uVar18 & 0xfffffffffffffffe;
        if (uVar13 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)((ulong)((uint)uVar18 & 1) ^ *(ulong *)(uVar13 + 0x28));
        }
        Aig_ObjCreateCo(pNew,pAVar12);
        iVar19 = iVar19 + 1;
      }
      lVar15 = lVar15 + 1;
    } while (lVar9 != lVar15);
  }
  if (0 < (int)uVar17) {
    ppvVar5 = vNodes0_00->pArray;
    uVar18 = 0;
    do {
      if (((*(uint *)((long)ppvVar5[uVar18] + 0x18) & 7) == 2) &&
         (iVar1 = *ppvVar5[uVar18], p1->nTruePis <= iVar1)) {
        uVar17 = (iVar1 - p1->nTruePis) + p1->nTruePos;
        if (((int)uVar17 < 0) || (p1->vCos->nSize <= (int)uVar17)) {
LAB_006fe101:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar7 = p1->vCos->pArray[uVar17];
        if (((ulong)pvVar7 & 1) != 0) {
LAB_006fe15e:
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                        ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
        }
        uVar13 = *(ulong *)((long)pvVar7 + 8);
        uVar14 = uVar13 & 0xfffffffffffffffe;
        if (uVar14 == 0) {
          pAVar12 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar12 = (Aig_Obj_t *)((ulong)((uint)uVar13 & 1) ^ *(ulong *)(uVar14 + 0x28));
        }
        Aig_ObjCreateCo(pNew,pAVar12);
        iVar19 = iVar19 + 1;
      }
      uVar18 = uVar18 + 1;
    } while (uVar10 != uVar18);
  }
  Aig_ManSetRegNum(pNew,iVar19);
  Aig_ManCleanup(pNew);
  if (vNodes0->pArray != (void **)0x0) {
    free(vNodes0->pArray);
  }
  free(vNodes0);
  if (vNodes0_00->pArray != (void **)0x0) {
    free(vNodes0_00->pArray);
  }
  free(vNodes0_00);
  return pNew;
}

Assistant:

Aig_Man_t * Saig_ManWindowExtractMiter( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj0, * pObj1, * pMatch0, * pMatch1;
    Vec_Ptr_t * vNodes0, * vNodes1;
    int i, nRegCount;
    // add matching of POs and LIs
    Saig_ManForEachPo( p0, pObj0, i )
    {
        pObj1 = Aig_ManCo( p1, i );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
    Saig_ManForEachLi( p0, pObj0, i )
    {
        pMatch0 = Saig_ObjLiToLo( p0, pObj0 );
        pMatch1 = Aig_ObjRepr( p0, pMatch0 );
        if ( pMatch1 == NULL )
            continue;
        assert( pMatch0 == Aig_ObjRepr( p1, pMatch1 ) );
        pObj1 = Saig_ObjLoToLi( p1, pMatch1 );
        Aig_ObjSetRepr( p0, pObj0, pObj1 );
        Aig_ObjSetRepr( p1, pObj1, pObj0 );
    }
    // clean the markings
    Aig_ManCleanData( p0 ); 
    Aig_ManCleanData( p1 ); 
    // collect nodes that are not linked
    vNodes0 = Saig_ManCollectedDiffNodes( p0, p1 );
    vNodes1 = Saig_ManCollectedDiffNodes( p1, p0 );
    // create the new manager
    pNew = Aig_ManStart( Vec_PtrSize(vNodes0) + Vec_PtrSize(vNodes1) );
    pNew->pName = Abc_UtilStrsav( "wnd" );
    pNew->pSpec = NULL;
    // map constant nodes
    pObj0 = Aig_ManConst1( p0 );
    pObj0->pData = Aig_ManConst1( pNew );
    pObj1 = Aig_ManConst1( p1 );
    pObj1->pData = Aig_ManConst1( pNew );
    // create real PIs
    Saig_ManWindowCreatePis( pNew, p0, p1, vNodes0 );
    Saig_ManWindowCreatePis( pNew, p1, p0, vNodes1 );
    // create register outputs
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Saig_ObjIsLo(p0, pObj0) )
            pObj0->pData = Aig_ObjCreateCi(pNew);
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Saig_ObjIsLo(p1, pObj1) )
            pObj1->pData = Aig_ObjCreateCi(pNew);
    }
    // create internal nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Aig_ObjIsNode(pObj0) )
            pObj0->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj0), Aig_ObjChild1Copy(pObj0) );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Aig_ObjIsNode(pObj1) )
            pObj1->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj1), Aig_ObjChild1Copy(pObj1) );
    }
    // create POs
    Saig_ManWindowCreatePos( pNew, p0, p1 );
//    Saig_ManWindowCreatePos( pNew, p1, p0 );
    // create register inputs
    nRegCount = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj0, i )
    {
        if ( Saig_ObjIsLo(p0, pObj0) )
        {
            pMatch0 = Saig_ObjLoToLi( p0, pObj0 );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch0) );
            nRegCount++;
        }
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes1, pObj1, i )
    {
        if ( Saig_ObjIsLo(p1, pObj1) )
        {
            pMatch1 = Saig_ObjLoToLi( p1, pObj1 );
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pMatch1) );
            nRegCount++;
        }
    }
    Aig_ManSetRegNum( pNew, nRegCount );
    Aig_ManCleanup( pNew );
    Vec_PtrFree( vNodes0 );
    Vec_PtrFree( vNodes1 );
    return pNew;
}